

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Inferences::ALASCA::Demodulation::Rhs> * __thiscall
Lib::OptionBase<Inferences::ALASCA::Demodulation::Rhs>::operator=
          (OptionBase<Inferences::ALASCA::Demodulation::Rhs> *this,
          OptionBase<Inferences::ALASCA::Demodulation::Rhs> *other)

{
  Rhs *t;
  byte *in_RSI;
  OptionBase<Inferences::ALASCA::Demodulation::Rhs> *in_RDI;
  Rhs local_30;
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Inferences::ALASCA::Demodulation::Rhs> *)0x3dcc07);
  }
  if ((*local_10 & 1) != 0) {
    t = unwrap((OptionBase<Inferences::ALASCA::Demodulation::Rhs> *)0x3dcc29);
    move_if_value<Inferences::ALASCA::Demodulation::Rhs,_true>(&local_30,t);
    MaybeUninit<Inferences::ALASCA::Demodulation::Rhs>::init
              (&in_RDI->_elem,(EVP_PKEY_CTX *)&local_30);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }